

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

int cram_decode_TD(char *cp,cram_block_compression_hdr *h)

{
  byte bVar1;
  uchar uVar2;
  cram_block *b;
  uchar *puVar3;
  uchar **ppuVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  size_t __size;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  int local_38;
  
  b = cram_new_block(FILE_HEADER,0);
  if (b == (cram_block *)0x0) {
    iVar6 = -1;
  }
  else {
    h->TD_blk = b;
    bVar1 = *cp;
    uVar10 = (uint)bVar1;
    uVar14 = 1;
    if ((char)bVar1 < '\0') {
      uVar13 = (uint)bVar1;
      uVar10 = (uint)(byte)cp[1];
      if (bVar1 < 0xc0) {
        uVar10 = (uVar13 & 0x3f) << 8 | uVar10;
        uVar14 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar10 = (uVar13 & 0x1f) << 0x10 | uVar10 << 8 | (uint)(byte)cp[2];
        uVar14 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar10 = (uVar13 & 0xf) << 0x18 | uVar10 << 0x10 | (uint)(byte)cp[2] << 8 |
                 (uint)(byte)cp[3];
        uVar14 = 4;
      }
      else {
        uVar10 = (byte)cp[4] & 0xf |
                 (uint)(byte)cp[3] << 4 | (uint)(byte)cp[2] << 0xc | uVar10 << 0x14 | uVar13 << 0x1c
        ;
        uVar14 = 5;
      }
    }
    if (uVar10 == 0) {
      h->nTL = 0;
      h->TL = (uchar **)0x0;
      cram_free_block(b);
    }
    else {
      sVar11 = (size_t)(int)uVar10;
      puVar3 = b->data;
      uVar7 = b->alloc;
      sVar12 = b->byte;
      if (uVar7 <= sVar12 + sVar11) {
        do {
          auVar15._8_4_ = (int)(uVar7 >> 0x20);
          auVar15._0_8_ = uVar7;
          auVar15._12_4_ = 0x45300000;
          dVar17 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
          uVar8 = (ulong)dVar17;
          __size = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
          if (uVar7 == 0) {
            __size = 0x400;
          }
          b->alloc = __size;
          puVar3 = (uchar *)realloc(puVar3,__size);
          b->data = puVar3;
          uVar7 = b->alloc;
          sVar12 = b->byte;
        } while (uVar7 <= sVar12 + sVar11);
      }
      memcpy(puVar3 + sVar12,cp + uVar14,sVar11);
      sVar12 = sVar11 + b->byte;
      b->byte = sVar12;
      puVar3 = b->data;
      if (puVar3[sVar12 - 1] != '\0') {
        uVar8 = b->alloc;
        uVar7 = sVar12 + 1;
        if (uVar8 <= uVar7) {
          do {
            auVar16._8_4_ = (int)(uVar8 >> 0x20);
            auVar16._0_8_ = uVar8;
            auVar16._12_4_ = 0x45300000;
            dVar17 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
            uVar7 = (ulong)dVar17;
            sVar11 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
            if (uVar8 == 0) {
              sVar11 = 0x400;
            }
            b->alloc = sVar11;
            puVar3 = (uchar *)realloc(puVar3,sVar11);
            b->data = puVar3;
            uVar8 = b->alloc;
            sVar12 = b->byte;
            uVar7 = sVar12 + 1;
          } while (uVar8 <= uVar7);
        }
        b->byte = uVar7;
        puVar3[sVar12] = '\0';
        puVar3 = b->data;
        sVar12 = b->byte;
      }
      local_38 = (int)cp;
      uVar13 = ((int)(cp + uVar14) + uVar10) - local_38;
      uVar14 = (ulong)uVar13;
      uVar10 = 0;
      if (sVar12 != 0) {
        iVar6 = 0;
        uVar10 = 0;
        do {
          puVar9 = puVar3 + iVar6;
          do {
            iVar6 = iVar6 + 1;
            uVar2 = *puVar9;
            puVar9 = puVar9 + 1;
          } while (uVar2 != '\0');
          uVar10 = uVar10 + 1;
        } while ((ulong)(long)iVar6 < sVar12);
      }
      h->nTL = uVar10;
      ppuVar4 = (uchar **)calloc((ulong)uVar10,8);
      h->TL = ppuVar4;
      uVar13 = -(uint)(ppuVar4 == (uchar **)0x0) | uVar13;
      if (ppuVar4 == (uchar **)0x0) {
        return uVar13;
      }
      if (sVar12 == 0) {
        return uVar13;
      }
      lVar5 = 0;
      uVar7 = 0;
      iVar6 = 0;
      do {
        h->TL[lVar5] = puVar3 + uVar7;
        puVar9 = puVar3 + iVar6;
        do {
          iVar6 = iVar6 + 1;
          uVar2 = *puVar9;
          puVar9 = puVar9 + 1;
        } while (uVar2 != '\0');
        lVar5 = lVar5 + 1;
        uVar7 = (ulong)iVar6;
      } while (uVar7 < sVar12);
    }
    iVar6 = (int)uVar14;
  }
  return iVar6;
}

Assistant:

int cram_decode_TD(char *cp, cram_block_compression_hdr *h) {
    char *op = cp;
    unsigned char *dat;
    cram_block *b;
    int32_t blk_size;
    int nTL, i, sz;

    if (!(b = cram_new_block(0, 0)))
	return -1;
    h->TD_blk = b;

    /* Decode */
    cp += itf8_get(cp, &blk_size);
    if (!blk_size) {
	h->nTL = 0;
	h->TL = NULL;
	cram_free_block(b);
        return cp - op;
    }

    BLOCK_APPEND(b, cp, blk_size);
    cp += blk_size;
    sz = cp - op;

    // Force nul termination if missing
    if (BLOCK_DATA(b)[BLOCK_SIZE(b)-1])
	BLOCK_APPEND_CHAR(b, '\0');

    /* Set up TL lookup table */
    dat = BLOCK_DATA(b);

    // Count
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	nTL++;
	while (dat[i])
	    i++;
    }

    // Copy
    h->nTL = nTL;
    if (!(h->TL = calloc(h->nTL, sizeof(unsigned char *))))
	return -1;
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	h->TL[nTL++] = &dat[i];
	while (dat[i])
	    i++;
    }
    
    return sz;
}